

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5ExprAddChildren(Fts5ExprNode *p,Fts5ExprNode *pSub)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = (long)p->nChild;
  if ((p->eType == 3) || (pSub->eType != p->eType)) {
    iVar1 = p->nChild + 1;
    p->nChild = iVar1;
    p->apChild[lVar3] = pSub;
  }
  else {
    memcpy(p->apChild + lVar3,pSub->apChild,(long)(pSub->nChild << 3));
    p->nChild = p->nChild + pSub->nChild;
    sqlite3_free(pSub);
    iVar1 = p->nChild;
  }
  for (; lVar3 < iVar1; lVar3 = lVar3 + 1) {
    iVar2 = p->apChild[lVar3]->iHeight + 1;
    if (iVar2 < p->iHeight) {
      iVar2 = p->iHeight;
    }
    p->iHeight = iVar2;
  }
  return;
}

Assistant:

static void fts5ExprAddChildren(Fts5ExprNode *p, Fts5ExprNode *pSub){
  int ii = p->nChild;
  if( p->eType!=FTS5_NOT && pSub->eType==p->eType ){
    int nByte = sizeof(Fts5ExprNode*) * pSub->nChild;
    memcpy(&p->apChild[p->nChild], pSub->apChild, nByte);
    p->nChild += pSub->nChild;
    sqlite3_free(pSub);
  }else{
    p->apChild[p->nChild++] = pSub;
  }
  for( ; ii<p->nChild; ii++){
    p->iHeight = MAX(p->iHeight, p->apChild[ii]->iHeight + 1);
  }
}